

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

void mp::
     WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,mp::LinTerms>
               (JSONW *jw,LinTerms *qt)

{
  ArrayRef<double> *in_RDI;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  LinTerms *in_stack_ffffffffffffff68;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff88;
  string_view in_stack_ffffffffffffff90;
  
  LinTerms::coefs(in_stack_ffffffffffffff68);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_stack_ffffffffffffff50,in_RDI);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x50bcc9);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x50bcd6);
  LinTerms::vars(in_stack_ffffffffffffff68);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_stack_ffffffffffffff50,(ArrayRef<int> *)in_RDI);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x50bd2e);
  ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x50bd38);
  return;
}

Assistant:

void WriteJSON(JSONW jw, const LinTerms& qt) {
  jw["coefs"] = qt.coefs();
  jw["vars"] = qt.vars();
}